

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-fast-dtoa.cpp
# Opt level: O3

bool __thiscall
icu_63::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  undefined4 in_register_00000014;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint64_t uVar12;
  int *piVar13;
  ulong unsafe_interval;
  uint64_t rest;
  ulong uVar14;
  ulong uVar15;
  FastDtoaMode FVar16;
  ulong uVar17;
  uint uVar18;
  DiyFp DVar19;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  DiyFp result;
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  DiyFp ten_mk;
  int *in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  DiyFp local_98;
  double local_80;
  uint64_t local_78;
  int local_6c;
  DiyFp local_68;
  DiyFp local_58;
  int *local_48;
  DiyFp local_40;
  
  lVar7 = CONCAT44(in_register_00000014,requested_digits);
  piVar13 = buffer._8_8_;
  uVar18 = (uint)this;
  local_98.f_ = (uint64_t)v;
  local_48 = length;
  if (uVar18 < 2) {
    local_80 = v;
    DVar19 = Double::AsNormalizedDiyFp((Double *)&local_98);
    local_78 = DVar19.f_;
    iVar3 = DVar19.e_;
    local_58.f_ = 0;
    local_58.e_ = 0;
    local_68.f_ = 0;
    local_68.e_ = 0;
    if (uVar18 == 0) {
      local_98.f_ = (uint64_t)local_80;
      Double::NormalizedBoundaries((Double *)&local_98,&local_58,&local_68);
    }
    else {
      local_98.f_ = CONCAT44(local_98.f_._4_4_,(float)local_80);
      Single::NormalizedBoundaries((Single *)&local_98,&local_58,&local_68);
    }
    local_40.f_ = 0;
    iVar10 = 0;
    local_40.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar3,-0x60 - iVar3,&local_40,&local_6c);
    local_98.f_ = local_78;
    local_98.e_ = iVar3;
    DiyFp::Multiply(&local_98,&local_40);
    uVar1 = local_98._8_8_;
    local_78 = local_98.f_;
    iVar3 = local_98.e_;
    local_98._12_4_ = local_58._12_4_;
    local_98.e_ = local_58.e_;
    local_98.f_ = local_58.f_;
    DiyFp::Multiply(&local_98,&local_40);
    local_80 = (double)local_98.f_;
    local_98._12_4_ = local_68._12_4_;
    local_98.e_ = local_68.e_;
    local_98.f_ = local_68.f_;
    DiyFp::Multiply(&local_98,&local_40);
    uVar8 = local_98.f_ + 1;
    bVar5 = -(char)uVar1;
    rest = 1L << (bVar5 & 0x3f);
    uVar9 = uVar8 >> (bVar5 & 0x3f);
    uVar15 = (local_98.f_ - (long)local_80) + 2;
    uVar14 = rest - 1;
    unsafe_interval = uVar8 & uVar14;
    iVar3 = iVar3 * 0x4d1 + 0x13911 >> 0xc;
    uVar12 = 1;
    if (*(uint *)(kSmallPowersOfTen + (long)iVar3 * 4 + 4) <= (uint)uVar9) {
      iVar3 = iVar3 + 1;
    }
    uVar17 = (ulong)*(uint *)(kSmallPowersOfTen + (long)iVar3 * 4);
    *piVar13 = 0;
    if (0 < iVar3) {
      uVar18 = iVar3 + 1;
      iVar10 = 0;
      do {
        uVar4 = uVar9 & 0xffffffff;
        uVar9 = uVar4 % uVar17;
        *(char *)(lVar7 + iVar10) = (char)(uVar4 / uVar17) + '0';
        iVar10 = *piVar13 + 1;
        *piVar13 = iVar10;
        uVar4 = (uVar9 << (bVar5 & 0x3f)) + unsafe_interval;
        local_80 = (double)uVar8;
        if (uVar4 < uVar15) {
          buffer_01.length_ = iVar10;
          buffer_01.start_ = (char *)lVar7;
          buffer_01._12_4_ = 0;
          bVar2 = RoundWeed(buffer_01,(int)uVar8 - (int)local_78,uVar15,uVar4,
                            uVar17 << (bVar5 & 0x3f),1,in_stack_ffffffffffffff60);
          if (!bVar2) goto LAB_00300fdf;
          iVar3 = (uVar18 - local_6c) + -2;
          goto LAB_00300fc9;
        }
        uVar17 = uVar17 / 10;
        uVar18 = uVar18 - 1;
      } while (1 < uVar18);
      iVar3 = 0;
    }
    do {
      uVar12 = uVar12 * 10;
      uVar15 = uVar15 * 10;
      *(char *)(lVar7 + iVar10) = (char)(unsafe_interval * 10 >> (bVar5 & 0x3f)) + '0';
      iVar10 = *piVar13 + 1;
      *piVar13 = iVar10;
      unsafe_interval = unsafe_interval * 10 & uVar14;
      iVar3 = iVar3 + -1;
    } while (uVar15 <= unsafe_interval);
    buffer_00.length_ = iVar10;
    buffer_00.start_ = (char *)lVar7;
    buffer_00._12_4_ = 0;
    bVar2 = RoundWeed(buffer_00,((int)uVar8 - (int)local_78) * (int)uVar12,uVar15,unsafe_interval,
                      rest,uVar12,in_stack_ffffffffffffff60);
    if (!bVar2) goto LAB_00300fdf;
    iVar3 = iVar3 - local_6c;
LAB_00300fc9:
    *local_48 = iVar3 + *piVar13;
    *(undefined1 *)(lVar7 + *piVar13) = 0;
    bVar2 = true;
  }
  else {
    if (uVar18 != 2) {
      abort();
    }
    DVar19 = Double::AsNormalizedDiyFp((Double *)&local_98);
    local_78 = DVar19.f_;
    iVar3 = DVar19.e_;
    local_58.f_ = 0;
    iVar10 = 0;
    local_58.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar3,-0x60 - iVar3,&local_58,(int *)&local_68);
    local_98.f_ = local_78;
    local_98.e_ = iVar3;
    DiyFp::Multiply(&local_98,&local_58);
    bVar5 = -(char)local_98.e_;
    uVar12 = 1L << (bVar5 & 0x3f);
    uVar14 = uVar12 - 1 & local_98.f_;
    uVar8 = local_98.f_ >> (bVar5 & 0x3f);
    uVar18 = local_98.e_ * 0x4d1 + 0x13911 >> 0xc;
    uVar6 = (uint)uVar8;
    if (*(uint *)(kSmallPowersOfTen + (long)(int)uVar18 * 4 + 4) <= uVar6) {
      uVar18 = uVar18 + 1;
    }
    uVar9 = (ulong)*(uint *)(kSmallPowersOfTen + (long)(int)uVar18 * 4);
    *piVar13 = 0;
    if (0 < (int)uVar18) {
      iVar10 = 0;
      uVar11 = uVar18;
      do {
        uVar15 = uVar8 & 0xffffffff;
        uVar8 = uVar15 % uVar9;
        uVar6 = (uint)uVar8;
        *(char *)(lVar7 + iVar10) = (char)(uVar15 / uVar9) + '0';
        iVar10 = *piVar13 + 1;
        *piVar13 = iVar10;
        uVar18 = uVar11 - 1;
        local_98.f_._0_4_ = uVar18;
        if (mode == FAST_DTOA_SHORTEST_SINGLE) goto LAB_00300f95;
        uVar9 = uVar9 / 10;
        mode = mode - FAST_DTOA_SHORTEST_SINGLE;
        bVar2 = 1 < uVar11;
        uVar11 = uVar18;
      } while (bVar2);
    }
    local_98.f_._0_4_ = uVar18;
    if (mode == FAST_DTOA_SHORTEST) {
LAB_00300f95:
      iVar3 = (uVar6 << (bVar5 & 0x3f)) + (int)uVar14;
      uVar12 = uVar9 << (bVar5 & 0x3f);
      uVar8 = 1;
LAB_00300fb6:
      buffer_02.length_ = iVar10;
      buffer_02.start_ = (char *)lVar7;
      buffer_02._12_4_ = 0;
      bVar2 = RoundWeedCounted(buffer_02,iVar3,uVar12,uVar8,(uint64_t)&local_98,
                               in_stack_ffffffffffffff58);
      if (bVar2) {
        iVar3 = (uint)local_98.f_ - (int)local_68.f_;
        goto LAB_00300fc9;
      }
    }
    else if ((0 < (int)mode) && (1 < uVar14)) {
      uVar8 = 1;
      do {
        uVar8 = uVar8 * 10;
        *(char *)(lVar7 + iVar10) = (char)(uVar14 * 10 >> (bVar5 & 0x3f)) + '0';
        iVar10 = *piVar13 + 1;
        *piVar13 = iVar10;
        FVar16 = mode - FAST_DTOA_SHORTEST_SINGLE;
        uVar14 = uVar14 * 10 & uVar12 - 1;
        uVar18 = uVar18 - 1;
        if (mode < FAST_DTOA_PRECISION) break;
        mode = FVar16;
      } while (uVar8 < uVar14);
      if (FVar16 == FAST_DTOA_SHORTEST) {
        iVar3 = (int)uVar14;
        local_98.f_._0_4_ = uVar18;
        goto LAB_00300fb6;
      }
    }
LAB_00300fdf:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}